

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

void init_error_limit(gdImagePtr oim,gdImagePtr nim,my_cquantize_ptr cquantize)

{
  int *piVar1;
  int local_30;
  uint local_2c;
  int out;
  int in;
  int *table;
  my_cquantize_ptr cquantize_local;
  gdImagePtr nim_local;
  gdImagePtr oim_local;
  
  piVar1 = (int *)gdMalloc(0x7fc);
  cquantize->error_limiter_storage = piVar1;
  if (cquantize->error_limiter_storage != (int *)0x0) {
    piVar1 = cquantize->error_limiter_storage + 0xff;
    cquantize->error_limiter = piVar1;
    local_30 = 0;
    for (local_2c = 0; (int)local_2c < 0x10; local_2c = local_2c + 1) {
      piVar1[(int)local_2c] = local_30;
      piVar1[(int)-local_2c] = -local_30;
      local_30 = local_30 + 1;
    }
    while ((int)local_2c < 0x30) {
      piVar1[(int)local_2c] = local_30;
      piVar1[(int)-local_2c] = -local_30;
      local_2c = local_2c + 1;
      local_30 = (uint)((local_2c & 1) == 0) + local_30;
    }
    for (; (int)local_2c < 0x100; local_2c = local_2c + 1) {
      piVar1[(int)local_2c] = local_30;
      piVar1[(int)-local_2c] = -local_30;
    }
  }
  return;
}

Assistant:

LOCAL (void)
init_error_limit (gdImagePtr oim, gdImagePtr nim, my_cquantize_ptr cquantize)
/* Allocate and fill in the error_limiter table */
{
	int *table;
	int in, out;
	(void)oim;
	(void)nim;

	cquantize->error_limiter_storage =
	    (int *) gdMalloc ((MAXJSAMPLE * 2 + 1) * sizeof (int));
	if (!cquantize->error_limiter_storage) {
		return;
	}
	table = cquantize->error_limiter_storage;

	table += MAXJSAMPLE;		/* so can index -MAXJSAMPLE .. +MAXJSAMPLE */
	cquantize->error_limiter = table;

#define STEPSIZE ((MAXJSAMPLE+1)/16)
	/* Map errors 1:1 up to +- MAXJSAMPLE/16 */
	out = 0;
	for (in = 0; in < STEPSIZE; in++, out++) {
		table[in] = out;
		table[-in] = -out;
	}
	/* Map errors 1:2 up to +- 3*MAXJSAMPLE/16 */
	for (; in < STEPSIZE * 3; in++, out += (in & 1) ? 0 : 1) {
		table[in] = out;
		table[-in] = -out;
	}
	/* Clamp the rest to final out value (which is (MAXJSAMPLE+1)/8) */
	for (; in <= MAXJSAMPLE; in++) {
		table[in] = out;
		table[-in] = -out;
	}
#undef STEPSIZE
}